

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O1

iterator __thiscall Track::find(Track *this,Header *header)

{
  bool bVar1;
  Sector *rhs;
  long lVar2;
  Sector *pSVar3;
  
  rhs = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
        super__Vector_impl_data._M_start;
  pSVar3 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pSVar3 - (long)rhs >> 8;
  if (0 < lVar2) {
    lVar2 = lVar2 + 1;
    do {
      bVar1 = Header::operator==(header,&rhs->header);
      if (bVar1) {
        return (iterator)rhs;
      }
      bVar1 = Header::operator==(header,&rhs[1].header);
      if (bVar1) {
        return (iterator)(rhs + 1);
      }
      bVar1 = Header::operator==(header,&rhs[2].header);
      if (bVar1) {
        return (iterator)(rhs + 2);
      }
      bVar1 = Header::operator==(header,&rhs[3].header);
      if (bVar1) {
        return (iterator)(rhs + 3);
      }
      rhs = rhs + 4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  lVar2 = (long)pSVar3 - (long)rhs >> 6;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      if (lVar2 != 3) {
        return (iterator)pSVar3;
      }
      bVar1 = Header::operator==(header,&rhs->header);
      if (bVar1) {
        return (iterator)rhs;
      }
      rhs = rhs + 1;
    }
    bVar1 = Header::operator==(header,&rhs->header);
    if (bVar1) {
      return (iterator)rhs;
    }
    rhs = rhs + 1;
  }
  bVar1 = Header::operator==(header,&rhs->header);
  if (bVar1) {
    pSVar3 = rhs;
  }
  return (iterator)pSVar3;
}

Assistant:

std::vector<Sector>::iterator Track::find(const Header& header)
{
    return std::find_if(begin(), end(), [&](const Sector& s) {
        return header == s.header;
        });
}